

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSslError>::moveAppend
          (QGenericArrayOps<QSslError> *this,QSslError *b,QSslError *e)

{
  QSslError *pQVar1;
  QSslError *in_RDX;
  QSslError *in_RSI;
  long in_RDI;
  QSslError *data;
  QSslError *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QSslError>::begin((QArrayDataPointer<QSslError> *)0x149057);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QSslError::QSslError(pQVar1 + *(long *)(in_RDI + 0x10) * 8,local_10);
      local_10 = local_10 + 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }